

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom-bounds-load.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Options *load;
  function<void_(void_*,_diy::BinaryBuffer_&)> *this;
  ContiguousAssigner read_assigner;
  Master read_master;
  Options ops;
  bool help;
  int nvals;
  int num_threads;
  int mem_blocks;
  int tot_blocks;
  communicator world;
  environment env;
  unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *in_stack_ffffffffffffe648;
  undefined8 uVar4;
  Master *in_stack_ffffffffffffe650;
  _func_void_void_ptr **in_stack_ffffffffffffe658;
  NeverSkip *__f;
  function<void_(void_*)> *in_stack_ffffffffffffe660;
  string *in_stack_ffffffffffffe670;
  undefined4 in_stack_ffffffffffffe678;
  undefined4 in_stack_ffffffffffffe67c;
  string *in_stack_ffffffffffffe680;
  Skip *s;
  char *in_stack_ffffffffffffe688;
  allocator<char> *f;
  undefined4 in_stack_ffffffffffffe690;
  undefined4 in_stack_ffffffffffffe694;
  undefined4 in_stack_ffffffffffffe698;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffe69c;
  undefined4 uVar6;
  ostream *in_stack_ffffffffffffe6a0;
  undefined4 in_stack_ffffffffffffe6b0;
  undefined4 in_stack_ffffffffffffe6b4;
  int *in_stack_ffffffffffffe6b8;
  string *in_stack_ffffffffffffe6c0;
  undefined8 in_stack_ffffffffffffe6c8;
  char s_00;
  Master *master;
  StaticAssigner *assigner;
  undefined4 in_stack_ffffffffffffe6fc;
  string *in_stack_ffffffffffffe700;
  Skip local_18c0;
  allocator<char> local_1899;
  string local_1898 [48];
  NeverSkip local_1868 [64];
  code *local_1828;
  code *local_1800;
  communicator local_17d8 [31];
  char **in_stack_ffffffffffffeb10;
  int in_stack_ffffffffffffeb1c;
  Options *in_stack_ffffffffffffeb20;
  allocator<char> local_189;
  string local_188 [39];
  allocator<char> local_161;
  string local_160 [47];
  allocator<char> local_131;
  string local_130 [39];
  allocator<char> local_109;
  string local_108 [47];
  undefined1 local_d9 [40];
  undefined1 local_b1 [101];
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  int local_40;
  communicator local_30;
  int local_4;
  
  s_00 = (char)((ulong)in_stack_ffffffffffffe6c8 >> 0x38);
  local_4 = 0;
  diy::mpi::environment::environment
            ((environment *)in_stack_ffffffffffffe650,
             (int)((ulong)in_stack_ffffffffffffe648 >> 0x20),(char **)0x11126d);
  diy::mpi::communicator::communicator((communicator *)in_stack_ffffffffffffe650);
  iVar2 = diy::mpi::communicator::size(&local_30);
  local_44 = 0xffffffff;
  local_48 = 1;
  local_4c = 100;
  local_40 = iVar2;
  opts::Options::Options((Options *)in_stack_ffffffffffffe650);
  assigner = (StaticAssigner *)local_b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe694,in_stack_ffffffffffffe690),in_stack_ffffffffffffe688
             ,(allocator<char> *)in_stack_ffffffffffffe680);
  master = (Master *)local_d9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe694,in_stack_ffffffffffffe690),in_stack_ffffffffffffe688
             ,(allocator<char> *)in_stack_ffffffffffffe680);
  opts::Option<int>(s_00,in_stack_ffffffffffffe6c0,in_stack_ffffffffffffe6b8,
                    (string *)CONCAT44(in_stack_ffffffffffffe6b4,in_stack_ffffffffffffe6b0));
  load = opts::Options::operator>>((Options *)in_stack_ffffffffffffe650,in_stack_ffffffffffffe648);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe694,in_stack_ffffffffffffe690),in_stack_ffffffffffffe688
             ,(allocator<char> *)in_stack_ffffffffffffe680);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe694,in_stack_ffffffffffffe690),in_stack_ffffffffffffe688
             ,(allocator<char> *)in_stack_ffffffffffffe680);
  opts::Option<int>(s_00,in_stack_ffffffffffffe6c0,in_stack_ffffffffffffe6b8,
                    (string *)CONCAT44(in_stack_ffffffffffffe6b4,in_stack_ffffffffffffe6b0));
  opts::Options::operator>>((Options *)in_stack_ffffffffffffe650,in_stack_ffffffffffffe648);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe694,in_stack_ffffffffffffe690),in_stack_ffffffffffffe688
             ,(allocator<char> *)in_stack_ffffffffffffe680);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe694,in_stack_ffffffffffffe690),in_stack_ffffffffffffe688
             ,(allocator<char> *)in_stack_ffffffffffffe680);
  opts::Option<bool>((char)((ulong)in_stack_ffffffffffffe688 >> 0x38),in_stack_ffffffffffffe680,
                     (bool *)CONCAT44(in_stack_ffffffffffffe67c,in_stack_ffffffffffffe678),
                     in_stack_ffffffffffffe670);
  opts::Options::operator>>((Options *)in_stack_ffffffffffffe650,in_stack_ffffffffffffe648);
  std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::~unique_ptr
            ((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             in_stack_ffffffffffffe650);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator(&local_189);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator(&local_161);
  std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::~unique_ptr
            ((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             in_stack_ffffffffffffe650);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator(&local_131);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator(&local_109);
  std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::~unique_ptr
            ((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             in_stack_ffffffffffffe650);
  std::__cxx11::string::~string((string *)(local_d9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_d9);
  std::__cxx11::string::~string((string *)(local_b1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_b1);
  bVar1 = opts::Options::parse
                    (in_stack_ffffffffffffeb20,in_stack_ffffffffffffeb1c,in_stack_ffffffffffffeb10);
  if ((bVar1) && ((local_b1[100] & 1) == 0)) {
    diy::mpi::communicator::communicator(local_17d8,&local_30);
    local_1800 = Block::create;
    uVar5 = local_48;
    uVar6 = local_44;
    std::function<void*()>::function<void*(*)(),void>
              ((function<void_*()> *)in_stack_ffffffffffffe660,
               (_func_void_ptr **)in_stack_ffffffffffffe658);
    local_1828 = Block::destroy;
    std::function<void(void*)>::function<void(*)(void*),void>
              (in_stack_ffffffffffffe660,in_stack_ffffffffffffe658);
    std::function<void_(const_void_*,_diy::BinaryBuffer_&)>::function
              ((function<void_(const_void_*,_diy::BinaryBuffer_&)> *)in_stack_ffffffffffffe650,
               in_stack_ffffffffffffe648);
    std::function<void_(void_*,_diy::BinaryBuffer_&)>::function
              ((function<void_(void_*,_diy::BinaryBuffer_&)> *)in_stack_ffffffffffffe650,
               in_stack_ffffffffffffe648);
    this = (function<void_(void_*,_diy::BinaryBuffer_&)> *)operator_new(0x10);
    diy::Master::QueueSizePolicy::QueueSizePolicy
              ((QueueSizePolicy *)in_stack_ffffffffffffe650,(size_t)in_stack_ffffffffffffe648);
    __f = local_1868;
    in_stack_ffffffffffffe650 = (Master *)(local_1868 + 0x20);
    uVar4 = 0;
    diy::Master::Master((Master *)read_master.mt_gen._M_x[0x14a],
                        (communicator *)read_master.mt_gen._M_x[0x149],
                        read_master.mt_gen._M_x[0x148]._4_4_,(int)read_master.mt_gen._M_x[0x148],
                        (CreateBlock *)read_master.mt_gen._M_x[0x147],
                        (DestroyBlock *)read_master.mt_gen._M_x[0x146],
                        (ExternalStorage *)read_master.mt_gen._M_x[0x14c],
                        (SaveBlock *)read_master.mt_gen._M_x[0x14d],
                        (LoadBlock *)read_master.mt_gen._M_x[0x14e],
                        (QueuePolicy *)read_master.mt_gen._M_x[0x14f]);
    std::function<void_(void_*,_diy::BinaryBuffer_&)>::~function
              ((function<void_(void_*,_diy::BinaryBuffer_&)> *)0x111979);
    std::function<void_(const_void_*,_diy::BinaryBuffer_&)>::~function
              ((function<void_(const_void_*,_diy::BinaryBuffer_&)> *)0x111986);
    std::function<void_(void_*)>::~function((function<void_(void_*)> *)0x111993);
    std::function<void_*()>::~function((function<void_*()> *)0x1119a0);
    diy::mpi::communicator::~communicator((communicator *)0x1119ad);
    iVar3 = diy::mpi::communicator::size(&local_30);
    diy::ContiguousAssigner::Assigner
              ((ContiguousAssigner *)in_stack_ffffffffffffe650,(int)((ulong)uVar4 >> 0x20),
               (int)uVar4);
    f = &local_1899;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(iVar3,in_stack_ffffffffffffe690),(char *)f,
               (allocator<char> *)in_stack_ffffffffffffe680);
    s = &local_18c0;
    std::function<void(void*,diy::BinaryBuffer&)>::function<void(*)(void*,diy::BinaryBuffer&),void>
              (this,(_func_void_void_ptr_BinaryBuffer_ptr **)__f);
    diy::io::read_blocks
              (in_stack_ffffffffffffe700,(communicator *)CONCAT44(in_stack_ffffffffffffe6fc,iVar2),
               assigner,master,(LoadBlock *)load);
    std::function<void_(void_*,_diy::BinaryBuffer_&)>::~function
              ((function<void_(void_*,_diy::BinaryBuffer_&)> *)0x111a67);
    std::__cxx11::string::~string(local_1898);
    std::allocator<char>::~allocator(&local_1899);
    diy::Master::size((Master *)0x111a9d);
    fmt::v7::print<char[26],unsigned_int,char>
              ((FILE *)CONCAT44(uVar6,uVar5),
               (char (*) [26])CONCAT44(iVar3,in_stack_ffffffffffffe690),(uint *)f);
    std::function<bool(int,diy::Master_const&)>::function<diy::Master::NeverSkip,void>
              ((function<bool_(int,_const_diy::Master_&)> *)this,__f);
    diy::Master::foreach<void(Block::*)(diy::Master::ProxyWithLink_const&)>
              ((Master *)CONCAT44(iVar3,in_stack_ffffffffffffe690),(offset_in_Block_to_subr *)f,s);
    std::function<bool_(int,_const_diy::Master_&)>::~function
              ((function<bool_(int,_const_diy::Master_&)> *)0x111b27);
    diy::ContiguousAssigner::~ContiguousAssigner((ContiguousAssigner *)0x111b34);
    diy::Master::~Master(in_stack_ffffffffffffe650);
  }
  else {
    iVar2 = diy::mpi::communicator::rank(&local_30);
    if (iVar2 == 0) {
      opts::operator<<(in_stack_ffffffffffffe6a0,
                       (Options *)CONCAT44(in_stack_ffffffffffffe69c,in_stack_ffffffffffffe698));
    }
    local_4 = 1;
  }
  opts::Options::~Options((Options *)in_stack_ffffffffffffe650);
  diy::mpi::communicator::~communicator((communicator *)0x111b66);
  diy::mpi::environment::~environment((environment *)0x111b73);
  return local_4;
}

Assistant:

int main(int argc, char** argv)
{
    // initialize MPI
    diy::mpi::environment  env(argc, argv);     // equivalent of MPI_Init(argc, argv)/MPI_Finalize()
    diy::mpi::communicator world;               // equivalent of MPI_COMM_WORLD

    int tot_blocks  = world.size();             // default number of global blocks
    int mem_blocks  = -1;                       // everything in core for now
    int num_threads = 1;                        // 1 thread for now
    int nvals       = 100;                      // number of values per block

    // get command line arguments
    bool help;
    opts::Options ops;
    ops >> opts::Option('b', "tot_blocks",  tot_blocks, " total number of blocks")
        >> opts::Option('n', "nvals",       nvals,      " number of values per block")
        >> opts::Option('h', "help",        help,       " show help");

  if (!ops.parse(argc,argv) || help)
  {
        if (world.rank() == 0)
            std::cout << ops;
        return 1;
    }

    // read the results back
    diy::Master read_master(world,
            num_threads,
            mem_blocks,
            &Block::create,
            &Block::destroy);
    diy::ContiguousAssigner   read_assigner(world.size(), -1);   // number of blocks set by read_blocks()

    diy::io::read_blocks("test.out", world, read_assigner, read_master, &Block::load);
    fmt::print(stderr, "{} blocks read from file\n", read_master.size());

    // debug: print the blocks
    read_master.foreach(&Block::print_data);
}